

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

size_t getnum(char **fmt,size_t df)

{
  char *pcVar1;
  int iVar2;
  bool local_29;
  char **local_28;
  size_t a;
  size_t df_local;
  char **fmt_local;
  
  iVar2 = digit((int)**fmt);
  fmt_local = (char **)df;
  if (iVar2 != 0) {
    local_28 = (char **)0x0;
    do {
      pcVar1 = *fmt;
      *fmt = pcVar1 + 1;
      local_28 = (char **)((long)local_28 * 10 + (ulong)((int)*pcVar1 - 0x30));
      iVar2 = digit((int)**fmt);
      local_29 = iVar2 != 0 && local_28 < (char **)0xccccccccccccccc;
      fmt_local = local_28;
    } while (local_29);
  }
  return (size_t)fmt_local;
}

Assistant:

static size_t getnum (const char **fmt, size_t df) {
  if (!digit(**fmt))  /* no number? */
    return df;  /* return default value */
  else {
    size_t a = 0;
    do {
      a = a*10 + cast_uint(*((*fmt)++) - '0');
    } while (digit(**fmt) && a <= (MAX_SIZE - 9)/10);
    return a;
  }
}